

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvafill.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **in_RSI;
  int in_EDI;
  int32_t i;
  int32_t v;
  int32_t b;
  int32_t a;
  int cnum;
  int c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    local_18 = 0;
    while (local_14 = getopt(local_8,local_10,"c:"), local_14 != -1) {
      if (local_14 == 99) {
        __isoc99_sscanf(_optarg,"%d",&local_18);
      }
    }
    if (local_18 < nva_cardsnum) {
      local_20 = 4;
      local_24 = 0;
      if (_optind < local_8) {
        __isoc99_sscanf(local_10[_optind],"%x",&local_1c);
        if (_optind + 1 < local_8) {
          __isoc99_sscanf(local_10[_optind + 1],"%x",&local_20);
        }
        if (_optind + 2 < local_8) {
          __isoc99_sscanf(local_10[_optind + 2],"%x",&local_24);
        }
        for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 4) {
          nva_wr32(local_18,local_1c + local_28,local_24 + local_28);
        }
        local_4 = 0;
      }
      else {
        fprintf(_stderr,"No address specified.\n");
        local_4 = 1;
      }
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      local_4 = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 4, v = 0, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	if (optind + 2 < argc)
		sscanf (argv[optind + 2], "%x", &v);
	for (i = 0; i < b; i += 4) {
		nva_wr32(cnum, a+i, v+i);
	}
	return 0;
}